

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

void __thiscall QTest::WatchDog::setExpectation(WatchDog *this,Expectation e)

{
  long lVar1;
  Expectation EVar2;
  Expectation in_RSI;
  mutex *in_RDI;
  long in_FS_OFFSET;
  size_t gen;
  Expectation cur;
  scoped_lock<std::mutex> locker;
  size_t local_30;
  mutex *pmVar3;
  atomic<QTest::WatchDog::Expectation> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (atomic<QTest::WatchDog::Expectation> *)&DAT_aaaaaaaaaaaaaaaa;
  pmVar3 = in_RDI;
  (anonymous_namespace)::qt_scoped_lock<std::mutex,std::scoped_lock<std::mutex>>(in_RDI);
  EVar2 = std::atomic<QTest::WatchDog::Expectation>::load
                    (this_00,(memory_order)((ulong)pmVar3 >> 0x20));
  local_30 = generation(EVar2);
  if (in_RSI == TestFunctionStart) {
    local_30 = local_30 + 1;
  }
  EVar2 = combine(in_RSI,local_30);
  std::atomic<QTest::WatchDog::Expectation>::store
            ((atomic<QTest::WatchDog::Expectation> *)
             &in_RDI[2].super___mutex_base._M_mutex.__data.__list,EVar2,memory_order_relaxed);
  std::condition_variable::notify_all();
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x1606bb);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setExpectation(Expectation e)
    {
        Q_ASSERT(generation(e) == 0); // no embedded generation allowed
        const auto locker = qt_scoped_lock(mutex);
        auto cur = expecting.load(std::memory_order_relaxed);
        auto gen = generation(cur);
        if (e == TestFunctionStart)
            ++gen;
        e = combine(e, gen);
        expecting.store(e, std::memory_order_relaxed);
        waitCondition.notify_all();
    }